

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::ByteSizeLong
          (NonMaximumSuppressionLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar2 = (ulong)(-(uint)(this->iouthreshold_ != 0.0) & 1);
  sVar3 = uVar2 * 5 + 5;
  sVar4 = uVar2 * 5;
  if (this->scorethreshold_ != 0.0) {
    sVar4 = sVar3;
  }
  if (NAN(this->scorethreshold_)) {
    sVar4 = sVar3;
  }
  if (this->maxboxes_ != 0) {
    uVar2 = this->maxboxes_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = sVar4 + 2;
  if (this->perclasssuppression_ == false) {
    sVar3 = sVar4;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t NonMaximumSuppressionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  size_t total_size = 0;

  // float iouThreshold = 1;
  if (this->iouthreshold() != 0) {
    total_size += 1 + 4;
  }

  // float scoreThreshold = 2;
  if (this->scorethreshold() != 0) {
    total_size += 1 + 4;
  }

  // uint64 maxBoxes = 3;
  if (this->maxboxes() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->maxboxes());
  }

  // bool perClassSuppression = 4;
  if (this->perclasssuppression() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}